

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::FileGenerator::FileGenerator
          (FileGenerator *this,FileDescriptor *file,Options *options,bool immutable_api)

{
  int iVar1;
  Context *this_00;
  pointer pCVar2;
  ClassNameResolver *pCVar3;
  ImmutableGeneratorFactory *this_01;
  reference this_02;
  pointer pGVar4;
  Descriptor *pDVar5;
  undefined4 extraout_var;
  reference this_03;
  FieldDescriptor *pFVar6;
  undefined4 extraout_var_00;
  int local_60;
  int local_5c;
  int i_1;
  int i;
  allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>
  local_36;
  allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>
  local_35 [20];
  byte local_21;
  Options *pOStack_20;
  bool immutable_api_local;
  Options *options_local;
  FileDescriptor *file_local;
  FileGenerator *this_local;
  
  this->file_ = file;
  local_21 = immutable_api;
  pOStack_20 = options;
  options_local = (Options *)file;
  file_local = (FileDescriptor *)this;
  FileJavaPackage_abi_cxx11_
            (&this->java_package_,(java *)file,(FileDescriptor *)(ulong)(immutable_api & 1),
             immutable_api);
  std::__cxx11::string::string((string *)&this->classname_);
  iVar1 = FileDescriptor::message_type_count((FileDescriptor *)options_local);
  std::
  allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>
  ::allocator(local_35);
  std::
  vector<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
  ::vector(&this->message_generators_,(long)iVar1,local_35);
  std::
  allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>
  ::~allocator(local_35);
  iVar1 = FileDescriptor::extension_count((FileDescriptor *)options_local);
  std::
  allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>
  ::allocator(&local_36);
  std::
  vector<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>_>
  ::vector(&this->extension_generators_,(long)iVar1,&local_36);
  std::
  allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>
  ::~allocator(&local_36);
  std::
  unique_ptr<google::protobuf::compiler::java::GeneratorFactory,std::default_delete<google::protobuf::compiler::java::GeneratorFactory>>
  ::unique_ptr<std::default_delete<google::protobuf::compiler::java::GeneratorFactory>,void>
            ((unique_ptr<google::protobuf::compiler::java::GeneratorFactory,std::default_delete<google::protobuf::compiler::java::GeneratorFactory>>
              *)&this->generator_factory_);
  this_00 = (Context *)operator_new(0xb0);
  Context::Context(this_00,(FileDescriptor *)options_local,pOStack_20);
  std::
  unique_ptr<google::protobuf::compiler::java::Context,std::default_delete<google::protobuf::compiler::java::Context>>
  ::unique_ptr<std::default_delete<google::protobuf::compiler::java::Context>,void>
            ((unique_ptr<google::protobuf::compiler::java::Context,std::default_delete<google::protobuf::compiler::java::Context>>
              *)&this->context_,this_00);
  pCVar2 = std::
           unique_ptr<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
           ::operator->(&this->context_);
  pCVar3 = Context::GetNameResolver(pCVar2);
  this->name_resolver_ = pCVar3;
  Options::Options(&this->options_,pOStack_20);
  this->immutable_api_ = (bool)(local_21 & 1);
  ClassNameResolver::GetFileClassName_abi_cxx11_
            ((string *)&i_1,this->name_resolver_,(FileDescriptor *)options_local,
             (bool)(local_21 & 1));
  std::__cxx11::string::operator=((string *)&this->classname_,(string *)&i_1);
  std::__cxx11::string::~string((string *)&i_1);
  this_01 = (ImmutableGeneratorFactory *)operator_new(0x10);
  pCVar2 = std::
           unique_ptr<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
           ::get(&this->context_);
  ImmutableGeneratorFactory::ImmutableGeneratorFactory(this_01,pCVar2);
  std::
  unique_ptr<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
  ::reset(&this->generator_factory_,(pointer)this_01);
  local_5c = 0;
  while( true ) {
    iVar1 = FileDescriptor::message_type_count(this->file_);
    if (iVar1 <= local_5c) break;
    this_02 = std::
              vector<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
              ::operator[](&this->message_generators_,(long)local_5c);
    pGVar4 = std::
             unique_ptr<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
             ::operator->(&this->generator_factory_);
    pDVar5 = FileDescriptor::message_type(this->file_,local_5c);
    iVar1 = (*pGVar4->_vptr_GeneratorFactory[2])(pGVar4,pDVar5);
    std::
    unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
    ::reset(this_02,(pointer)CONCAT44(extraout_var,iVar1));
    local_5c = local_5c + 1;
  }
  local_60 = 0;
  while( true ) {
    iVar1 = FileDescriptor::extension_count(this->file_);
    if (iVar1 <= local_60) break;
    this_03 = std::
              vector<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>_>
              ::operator[](&this->extension_generators_,(long)local_60);
    pGVar4 = std::
             unique_ptr<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
             ::operator->(&this->generator_factory_);
    pFVar6 = FileDescriptor::extension(this->file_,local_60);
    iVar1 = (*pGVar4->_vptr_GeneratorFactory[3])(pGVar4,pFVar6);
    std::
    unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
    ::reset(this_03,(pointer)CONCAT44(extraout_var_00,iVar1));
    local_60 = local_60 + 1;
  }
  return;
}

Assistant:

FileGenerator::FileGenerator(const FileDescriptor* file, const Options& options,
                             bool immutable_api)
    : file_(file),
      java_package_(FileJavaPackage(file, immutable_api)),
      message_generators_(file->message_type_count()),
      extension_generators_(file->extension_count()),
      context_(new Context(file, options)),
      name_resolver_(context_->GetNameResolver()),
      options_(options),
      immutable_api_(immutable_api) {
  classname_ = name_resolver_->GetFileClassName(file, immutable_api);
  generator_factory_.reset(new ImmutableGeneratorFactory(context_.get()));
  for (int i = 0; i < file_->message_type_count(); ++i) {
    message_generators_[i].reset(
        generator_factory_->NewMessageGenerator(file_->message_type(i)));
  }
  for (int i = 0; i < file_->extension_count(); ++i) {
    extension_generators_[i].reset(
        generator_factory_->NewExtensionGenerator(file_->extension(i)));
  }
}